

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<unsigned_char,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::VectorStringCastOperator<duckdb::IntCastToVarInt>>
               (uchar *ldata,string_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ulong uVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ulong uVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  idx_t iVar8;
  undefined8 uVar9;
  char *extraout_RDX;
  char *pcVar10;
  char *extraout_RDX_00;
  idx_t iVar11;
  ulong uVar12;
  ulong uVar13;
  char **ppcVar14;
  Vector *result;
  ulong uVar15;
  ulong uVar16;
  string_t sVar17;
  Vector *result_1;
  char **local_80;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_38;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_80 = &(result_data->value).pointer.ptr;
      iVar11 = 0;
      pcVar10 = (char *)count;
      do {
        sVar17 = IntToVarInt<unsigned_char>
                           ((duckdb *)dataptr,(Vector *)(ulong)ldata[iVar11],(uchar)pcVar10);
        pcVar10 = sVar17.value._8_8_;
        iVar8 = sVar17.value._0_8_;
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(local_80 + -1);
        paVar1->length = (int)iVar8;
        paVar1->prefix[0] = (char)(iVar8 >> 0x20);
        paVar1->prefix[1] = (char)(iVar8 >> 0x28);
        paVar1->prefix[2] = (char)(iVar8 >> 0x30);
        paVar1->prefix[3] = (char)(iVar8 >> 0x38);
        *local_80 = pcVar10;
        iVar11 = iVar11 + 1;
        local_80 = local_80 + 2;
      } while (count != iVar11);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_48,(unsigned_long **)mask,&local_38);
      p_Var5 = p_Stack_40;
      peVar4 = local_48;
      local_48 = (element_type *)0x0;
      p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar4;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var5;
      if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
         p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
      pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar7->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      pcVar10 = extraout_RDX;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar2;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
      pcVar10 = extraout_RDX_00;
    }
    if (0x3f < count + 0x3f) {
      uVar13 = 0;
      uVar15 = 0;
      do {
        puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          uVar16 = uVar13 + 0x40;
          if (count <= uVar13 + 0x40) {
            uVar16 = count;
          }
LAB_013bab19:
          uVar6 = uVar13;
          if (uVar13 < uVar16) {
            ppcVar14 = &result_data[uVar13].value.pointer.ptr;
            do {
              sVar17 = IntToVarInt<unsigned_char>
                                 ((duckdb *)dataptr,(Vector *)(ulong)ldata[uVar13],(uchar)pcVar10);
              pcVar10 = sVar17.value._8_8_;
              uVar9 = sVar17.value._0_8_;
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar14 + -1);
              paVar1->length = (int)uVar9;
              paVar1->prefix[0] = (char)((ulong)uVar9 >> 0x20);
              paVar1->prefix[1] = (char)((ulong)uVar9 >> 0x28);
              paVar1->prefix[2] = (char)((ulong)uVar9 >> 0x30);
              paVar1->prefix[3] = (char)((ulong)uVar9 >> 0x38);
              *ppcVar14 = pcVar10;
              uVar13 = uVar13 + 1;
              ppcVar14 = ppcVar14 + 2;
              uVar6 = uVar16;
            } while (uVar16 != uVar13);
          }
        }
        else {
          uVar3 = puVar2[uVar15];
          uVar16 = uVar13 + 0x40;
          if (count <= uVar13 + 0x40) {
            uVar16 = count;
          }
          uVar6 = uVar16;
          if (uVar3 != 0) {
            if (uVar3 == 0xffffffffffffffff) goto LAB_013bab19;
            uVar6 = uVar13;
            if (uVar13 < uVar16) {
              ppcVar14 = &result_data[uVar13].value.pointer.ptr;
              uVar12 = 0;
              do {
                if ((uVar3 >> (uVar12 & 0x3f) & 1) != 0) {
                  sVar17 = IntToVarInt<unsigned_char>
                                     ((duckdb *)dataptr,(Vector *)(ulong)ldata[uVar12 + uVar13],
                                      (uchar)pcVar10);
                  pcVar10 = sVar17.value._8_8_;
                  uVar9 = sVar17.value._0_8_;
                  paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar14 + -1);
                  paVar1->length = (int)uVar9;
                  paVar1->prefix[0] = (char)((ulong)uVar9 >> 0x20);
                  paVar1->prefix[1] = (char)((ulong)uVar9 >> 0x28);
                  paVar1->prefix[2] = (char)((ulong)uVar9 >> 0x30);
                  paVar1->prefix[3] = (char)((ulong)uVar9 >> 0x38);
                  *ppcVar14 = pcVar10;
                }
                uVar12 = uVar12 + 1;
                ppcVar14 = ppcVar14 + 2;
                uVar6 = uVar16;
              } while (uVar16 - uVar13 != uVar12);
            }
          }
        }
        uVar13 = uVar6;
        uVar15 = uVar15 + 1;
      } while (uVar15 != count + 0x3f >> 6);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}